

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_find_case(void)

{
  byte bVar1;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [376];
  
  bson_init(local_180);
  bVar1 = bson_append_utf8(local_180,"key",0xffffffff,"value");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x160,"test_bson_iter_find_case","bson_append_utf8 (&b, \"key\", -1, \"value\", -1)");
    abort();
  }
  bVar1 = bson_iter_init(auStack_200,local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x161,"test_bson_iter_find_case","bson_iter_init (&iter, &b)");
    abort();
  }
  bVar1 = bson_iter_find_case(auStack_200,"KEY");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x162,"test_bson_iter_find_case","bson_iter_find_case (&iter, \"KEY\")");
    abort();
  }
  bVar1 = bson_iter_init(auStack_200,local_180);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x163,"test_bson_iter_find_case","bson_iter_init (&iter, &b)");
    abort();
  }
  bVar1 = bson_iter_find(auStack_200,"KEY");
  if (((bVar1 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x164,"test_bson_iter_find_case","!bson_iter_find (&iter, \"KEY\")");
    abort();
  }
  bson_destroy(local_180);
  return;
}

Assistant:

static void
test_bson_iter_find_case (void)
{
   bson_t b;
   bson_iter_t iter;

   bson_init (&b);
   BSON_ASSERT (bson_append_utf8 (&b, "key", -1, "value", -1));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find_case (&iter, "KEY"));
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (!bson_iter_find (&iter, "KEY"));
   bson_destroy (&b);
}